

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

ENetProtocolCommand
enet_protocol_remove_sent_reliable_command
          (ENetPeer *peer,uint16_t reliableSequenceNumber,uint8_t channelID)

{
  ENetChannel *pEVar1;
  _ENetListNode *p_Var2;
  ushort uVar3;
  bool bVar4;
  uint16_t reliableWindow;
  ENetChannel *channel;
  int wasSent;
  ENetProtocolCommand commandNumber;
  ENetListIterator currentCommand;
  ENetOutgoingCommand *outgoingCommand;
  uint8_t channelID_local;
  uint16_t reliableSequenceNumber_local;
  ENetPeer *peer_local;
  
  currentCommand = (ENetListIterator)0x0;
  bVar4 = true;
  for (_wasSent = (peer->sentReliableCommands).sentinel.next;
      _wasSent != &(peer->sentReliableCommands).sentinel; _wasSent = _wasSent->next) {
    currentCommand = _wasSent;
    if ((*(uint16_t *)&_wasSent[1].next == reliableSequenceNumber) &&
       (*(uint8_t *)((long)&_wasSent[2].previous + 1) == channelID)) break;
  }
  if (_wasSent == &(peer->sentReliableCommands).sentinel) {
    for (_wasSent = (peer->outgoingCommands).sentinel.next;
        _wasSent != &(peer->outgoingCommands).sentinel; _wasSent = _wasSent->next) {
      currentCommand = _wasSent;
      if (*(short *)((long)&_wasSent[2].next + 6) == 0) {
        return ENET_PROTOCOL_COMMAND_NONE;
      }
      if ((*(uint16_t *)&_wasSent[1].next == reliableSequenceNumber) &&
         (*(uint8_t *)((long)&_wasSent[2].previous + 1) == channelID)) break;
    }
    if (_wasSent == &(peer->outgoingCommands).sentinel) {
      return ENET_PROTOCOL_COMMAND_NONE;
    }
    bVar4 = false;
  }
  if (currentCommand == (ENetListIterator)0x0) {
    peer_local._4_4_ = ENET_PROTOCOL_COMMAND_NONE;
  }
  else {
    if ((ulong)channelID < peer->channelCount) {
      pEVar1 = peer->channels;
      uVar3 = reliableSequenceNumber / 0x1000;
      if ((pEVar1[channelID].reliableWindows[uVar3] != 0) &&
         (pEVar1[channelID].reliableWindows[uVar3] = pEVar1[channelID].reliableWindows[uVar3] - 1,
         pEVar1[channelID].reliableWindows[uVar3] == 0)) {
        pEVar1[channelID].usedReliableWindows =
             pEVar1[channelID].usedReliableWindows & ((ushort)(1 << (sbyte)uVar3) ^ 0xffff);
      }
    }
    peer_local._4_4_ = *(byte *)&currentCommand[2].previous & ENET_PROTOCOL_COMMAND_MASK;
    enet_list_remove(currentCommand);
    if (currentCommand[5].previous != (_ENetListNode *)0x0) {
      if (bVar4) {
        peer->reliableDataInTransit =
             peer->reliableDataInTransit - (uint)*(ushort *)((long)&currentCommand[2].next + 4);
      }
      *(int *)&currentCommand[5].previous[1].previous =
           *(int *)&currentCommand[5].previous[1].previous + -1;
      if (*(int *)&currentCommand[5].previous[1].previous == 0) {
        *(uint *)&(currentCommand[5].previous)->next =
             *(uint *)&(currentCommand[5].previous)->next | 0x100;
        enet_packet_destroy((ENetPacket *)currentCommand[5].previous);
      }
    }
    enet_free(currentCommand);
    if ((peer->sentReliableCommands).sentinel.next != &(peer->sentReliableCommands).sentinel) {
      p_Var2 = (peer->sentReliableCommands).sentinel.next;
      peer->nextTimeout = *(int *)((long)&p_Var2[1].next + 4) + *(int *)&p_Var2[1].previous;
    }
  }
  return peer_local._4_4_;
}

Assistant:

static ENetProtocolCommand enet_protocol_remove_sent_reliable_command(ENetPeer* peer, uint16_t reliableSequenceNumber, uint8_t channelID) {
	ENetOutgoingCommand* outgoingCommand = NULL;
	ENetListIterator currentCommand;
	ENetProtocolCommand commandNumber;

	int wasSent = 1;

	for (currentCommand = enet_list_begin(&peer->sentReliableCommands); currentCommand != enet_list_end(&peer->sentReliableCommands); currentCommand = enet_list_next(currentCommand)) {
		outgoingCommand = (ENetOutgoingCommand*)currentCommand;

		if (outgoingCommand->reliableSequenceNumber == reliableSequenceNumber && outgoingCommand->command.header.channelID == channelID)
			break;
	}

	if (currentCommand == enet_list_end(&peer->sentReliableCommands)) {
		for (currentCommand = enet_list_begin(&peer->outgoingCommands); currentCommand != enet_list_end(&peer->outgoingCommands); currentCommand = enet_list_next(currentCommand)) {
			outgoingCommand = (ENetOutgoingCommand*)currentCommand;

			if (outgoingCommand->sendAttempts < 1)
				return ENET_PROTOCOL_COMMAND_NONE;

			if (outgoingCommand->reliableSequenceNumber == reliableSequenceNumber && outgoingCommand->command.header.channelID == channelID)
				break;
		}

		if (currentCommand == enet_list_end(&peer->outgoingCommands))
			return ENET_PROTOCOL_COMMAND_NONE;

		wasSent = 0;
	}

	if (outgoingCommand == NULL)
		return ENET_PROTOCOL_COMMAND_NONE;

	if (channelID < peer->channelCount) {
		ENetChannel* channel = &peer->channels[channelID];
		uint16_t reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

		if (channel->reliableWindows[reliableWindow] > 0) {
			--channel->reliableWindows[reliableWindow];

			if (!channel->reliableWindows[reliableWindow])
				channel->usedReliableWindows &= ~(1 << reliableWindow);
		}
	}

	commandNumber = (ENetProtocolCommand)(outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK);

	enet_list_remove(&outgoingCommand->outgoingCommandList);

	if (outgoingCommand->packet != NULL) {
		if (wasSent)
			peer->reliableDataInTransit -= outgoingCommand->fragmentLength;

		--outgoingCommand->packet->referenceCount;

		if (outgoingCommand->packet->referenceCount == 0) {
			outgoingCommand->packet->flags |= ENET_PACKET_FLAG_SENT;

			enet_packet_destroy(outgoingCommand->packet);
		}
	}

	enet_free(outgoingCommand);

	if (enet_list_empty(&peer->sentReliableCommands))
		return commandNumber;

	outgoingCommand = (ENetOutgoingCommand*)enet_list_front(&peer->sentReliableCommands);
	peer->nextTimeout = outgoingCommand->sentTime + outgoingCommand->roundTripTimeout;

	return commandNumber;
}